

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O0

nng_err http_res_parse_line(nng_http *conn,uint8_t *line)

{
  nng_http_status nVar1;
  char *pcVar2;
  char *pcVar3;
  int status;
  char *version;
  char *codestr;
  char *reason;
  uint8_t *line_local;
  nng_http *conn_local;
  
  pcVar2 = strchr((char *)line,0x20);
  if (pcVar2 == (char *)0x0) {
    conn_local._4_4_ = NNG_EPROTO;
  }
  else {
    *pcVar2 = '\0';
    pcVar3 = strchr(pcVar2 + 1,0x20);
    if (pcVar3 == (char *)0x0) {
      conn_local._4_4_ = NNG_EPROTO;
    }
    else {
      *pcVar3 = '\0';
      nVar1 = atoi(pcVar2 + 1);
      if (((int)nVar1 < 100) || (999 < (int)nVar1)) {
        conn_local._4_4_ = NNG_EPROTO;
      }
      else {
        nni_http_set_status(conn,nVar1 & 0xffff,pcVar3 + 1);
        conn_local._4_4_ = nni_http_set_version(conn,(char *)line);
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static nng_err
http_res_parse_line(nng_http *conn, uint8_t *line)
{
	char *reason;
	char *codestr;
	char *version;
	int   status;

	version = (char *) line;
	if ((codestr = strchr(version, ' ')) == NULL) {
		return (NNG_EPROTO);
	}
	*codestr = '\0';
	codestr++;

	if ((reason = strchr(codestr, ' ')) == NULL) {
		return (NNG_EPROTO);
	}
	*reason = '\0';
	reason++;

	status = atoi(codestr);
	if ((status < 100) || (status > 999)) {
		return (NNG_EPROTO);
	}

	nni_http_set_status(conn, (uint16_t) status, reason);

	return (nni_http_set_version(conn, version));
}